

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSpecsOf.hpp
# Opt level: O3

void __thiscall sciplot::LineSpecs::~LineSpecs(LineSpecs *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)&this->super_LineSpecsOf<sciplot::LineSpecs> = &PTR__LineSpecsOf_001a6c90;
  pcVar2 = (this->super_LineSpecsOf<sciplot::LineSpecs>).m_dashtype._M_dataplus._M_p;
  paVar1 = &(this->super_LineSpecsOf<sciplot::LineSpecs>).m_dashtype.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_LineSpecsOf<sciplot::LineSpecs>).m_linecolor._M_dataplus._M_p;
  paVar1 = &(this->super_LineSpecsOf<sciplot::LineSpecs>).m_linecolor.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_LineSpecsOf<sciplot::LineSpecs>).m_linewidth._M_dataplus._M_p;
  paVar1 = &(this->super_LineSpecsOf<sciplot::LineSpecs>).m_linewidth.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_LineSpecsOf<sciplot::LineSpecs>).m_linetype._M_dataplus._M_p;
  paVar1 = &(this->super_LineSpecsOf<sciplot::LineSpecs>).m_linetype.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_LineSpecsOf<sciplot::LineSpecs>).m_linestyle._M_dataplus._M_p;
  paVar1 = &(this->super_LineSpecsOf<sciplot::LineSpecs>).m_linestyle.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0xa8);
  return;
}

Assistant:

LineSpecsOf<DerivedSpecs>::LineSpecsOf()
{
}